

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  char **ppcVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ThreadPool *this;
  FILE *__s;
  runtime_error *this_00;
  long lVar15;
  void *pvVar16;
  Gamut gamut;
  void *pvVar17;
  ulong uVar18;
  char *pcVar19;
  pointer __p;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  int res;
  float *out;
  float *scale;
  uint local_a8;
  int local_a4;
  char **local_a0;
  int local_94;
  ulong local_90;
  void *local_88;
  void *local_80;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  void *local_58;
  undefined8 uStack_50;
  code *pcStack_48;
  code *pcStack_40;
  
  if (argc < 3) {
    pcVar19 = 
    "Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\nwhere <gamut> is one of sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020"
    ;
  }
  else {
    gamut = SRGB;
    if (argc != 3) {
      pcVar19 = argv[3];
      iVar12 = strcasecmp(pcVar19,"sRGB");
      gamut = SRGB;
      if (iVar12 != 0) {
        iVar12 = strcasecmp(pcVar19,"eRGB");
        if (iVar12 == 0) {
          gamut = ERGB;
        }
        else {
          iVar12 = strcasecmp(pcVar19,"XYZ");
          if (iVar12 == 0) {
            gamut = XYZ;
          }
          else {
            iVar12 = strcasecmp(pcVar19,"ProPhotoRGB");
            if (iVar12 == 0) {
              gamut = ProPhotoRGB;
            }
            else {
              iVar12 = strcasecmp(pcVar19,"ACES2065_1");
              if (iVar12 == 0) {
                gamut = ACES2065_1;
              }
              else {
                iVar12 = strcasecmp(pcVar19,"REC2020");
                if (iVar12 == 0) {
                  gamut = REC2020;
                }
                else {
                  iVar12 = strcasecmp(pcVar19,"DCI_P3");
                  gamut = NO_GAMUT - (iVar12 == 0);
                }
              }
            }
          }
        }
      }
    }
    if (gamut == NO_GAMUT) {
      main_cold_1();
    }
    else {
      init_tables(gamut);
      local_a8 = atoi(argv[1]);
      if (local_a8 != 0) {
        iVar13 = std::thread::hardware_concurrency();
        iVar12 = 1;
        if (1 < iVar13) {
          iVar12 = iVar13;
        }
        uVar28 = extraout_XMM0_Qb;
        this = (ThreadPool *)operator_new(0x80);
        ThreadPool::ThreadPool(this,iVar12);
        local_78._M_unused._M_object = (void **)0x0;
        std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                  ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,this
                  );
        std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::~unique_ptr
                  ((unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *)&local_78);
        local_a0 = argv;
        printf("Optimizing %s spectra...\n",argv[3]);
        fflush(_stdout);
        uVar14 = local_a8;
        lVar15 = (long)(int)local_a8;
        uVar18 = lVar15 * 4;
        if (lVar15 < 0) {
          uVar18 = 0xffffffffffffffff;
        }
        local_80 = operator_new__(uVar18);
        if (0 < lVar15) {
          auVar29._0_8_ = (double)(int)(uVar14 - 1);
          auVar29._8_8_ = uVar28;
          auVar21 = vpbroadcastq_avx512f();
          auVar22 = vbroadcastsd_avx512f(auVar29);
          auVar10 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          lVar15 = 0;
          auVar24 = vbroadcastsd_avx512f(ZEXT816(0x4008000000000000));
          auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar30._8_4_ = 8;
          auVar30._0_8_ = 0x800000008;
          auVar30._12_4_ = 8;
          auVar30._16_4_ = 8;
          auVar30._20_4_ = 8;
          auVar30._24_4_ = 8;
          auVar30._28_4_ = 8;
          do {
            auVar26 = vcvtudq2pd_avx512f(auVar10);
            auVar26 = vdivpd_avx512f(auVar26,auVar22);
            auVar27 = vmulpd_avx512f(auVar26,auVar26);
            auVar26 = vaddpd_avx512f(auVar26,auVar26);
            auVar26 = vsubpd_avx512f(auVar24,auVar26);
            auVar26 = vmulpd_avx512f(auVar27,auVar26);
            auVar27 = vmulpd_avx512f(auVar26,auVar26);
            auVar26 = vaddpd_avx512f(auVar26,auVar26);
            auVar26 = vsubpd_avx512f(auVar24,auVar26);
            auVar26 = vmulpd_avx512f(auVar27,auVar26);
            auVar20 = vcvtpd2ps_avx512f(auVar26);
            uVar18 = vpcmpuq_avx512f(auVar23,auVar21,2);
            puVar1 = (uint *)((long)local_80 + lVar15);
            bVar2 = (bool)((byte)uVar18 & 1);
            bVar3 = (bool)((byte)(uVar18 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar18 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
            bVar9 = SUB81(uVar18 >> 7,0);
            *puVar1 = (uint)bVar2 * auVar20._0_4_ | (uint)!bVar2 * *puVar1;
            puVar1[1] = (uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * puVar1[1];
            puVar1[2] = (uint)bVar4 * auVar20._8_4_ | (uint)!bVar4 * puVar1[2];
            puVar1[3] = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * puVar1[3];
            puVar1[4] = (uint)bVar6 * auVar20._16_4_ | (uint)!bVar6 * puVar1[4];
            puVar1[5] = (uint)bVar7 * auVar20._20_4_ | (uint)!bVar7 * puVar1[5];
            puVar1[6] = (uint)bVar8 * auVar20._24_4_ | (uint)!bVar8 * puVar1[6];
            puVar1[7] = (uint)bVar9 * auVar20._28_4_ | (uint)!bVar9 * puVar1[7];
            auVar23 = vpaddq_avx512f(auVar23,auVar25);
            auVar10 = vpaddd_avx2(auVar10,auVar30);
            lVar15 = lVar15 + 0x20;
          } while ((ulong)(uVar14 + 7 >> 3) << 5 != lVar15);
        }
        iVar12 = uVar14 * uVar14 * uVar14 * 9;
        uVar18 = (long)iVar12 * 4;
        if (iVar12 < 0) {
          uVar18 = 0xffffffffffffffff;
        }
        local_88 = operator_new__(uVar18);
        local_a4 = 0;
        do {
          lVar15 = (long)(int)local_a8;
          local_58 = (void *)0x0;
          uStack_50 = 0;
          pcStack_48 = (code *)0x0;
          pcStack_40 = (code *)0x0;
          local_58 = operator_new(0x20);
          *(uint **)local_58 = &local_a8;
          *(void ***)((long)local_58 + 8) = &local_80;
          *(int **)((long)local_58 + 0x10) = &local_a4;
          *(void ***)((long)local_58 + 0x18) = &local_88;
          pcStack_40 = std::
                       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/cmd/rgb2spec_opt.cpp:826:29)>
                       ::_M_invoke;
          pcStack_48 = std::
                       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/cmd/rgb2spec_opt.cpp:826:29)>
                       ::_M_manager;
          local_78._8_8_ = 0;
          pcStack_60 = std::
                       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/cmd/rgb2spec_opt.cpp:603:9)>
                       ::_M_invoke;
          pcStack_68 = std::
                       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/cmd/rgb2spec_opt.cpp:603:9)>
                       ::_M_manager;
          local_78._M_unused._M_object = &local_58;
          ParallelFor(0,lVar15,(function<void_(long,_long)> *)&local_78,(char *)&local_88);
          if (pcStack_68 != (code *)0x0) {
            (*pcStack_68)(&local_78,&local_78,__destroy_functor);
          }
          if (pcStack_48 != (code *)0x0) {
            (*pcStack_48)(&local_58,&local_58,3);
          }
          ppcVar11 = local_a0;
          iVar12 = local_a4 + 1;
          bVar2 = local_a4 < 2;
          local_a4 = iVar12;
        } while (bVar2);
        __s = fopen(local_a0[2],"w");
        if (__s != (FILE *)0x0) {
          fwrite("namespace pbrt {\n",0x11,1,__s);
          local_90 = 0;
          fprintf(__s,"extern const int %sToSpectrumTable_Res = %d;\n",ppcVar11[3],(ulong)local_a8);
          fprintf(__s,"extern const float %sToSpectrumTable_Scale[%d] = {\n",ppcVar11[3],
                  (ulong)local_a8);
          if (0 < (int)local_a8) {
            lVar15 = 0;
            do {
              fprintf(__s,"%.9g, ",(double)*(float *)((long)local_80 + lVar15 * 4));
              lVar15 = lVar15 + 1;
            } while (lVar15 < (int)local_a8);
          }
          fwrite("};\n",3,1,__s);
          fprintf(__s,"extern const float %sToSpectrumTable_Data[3][%d][%d][%d][3] = {\n",
                  ppcVar11[3],(ulong)local_a8,(ulong)local_a8,(ulong)local_a8);
          pvVar17 = local_88;
          do {
            fwrite("{ ",2,1,__s);
            if (0 < (int)local_a8) {
              iVar12 = 0;
              do {
                local_94 = iVar12;
                fwrite("{ ",2,1,__s);
                if (0 < (int)local_a8) {
                  iVar12 = 0;
                  do {
                    fwrite("{ ",2,1,__s);
                    if (0 < (int)local_a8) {
                      local_a0 = (char **)CONCAT44(local_a0._4_4_,iVar12);
                      iVar12 = 0;
                      do {
                        pvVar16 = pvVar17;
                        fwrite("{ ",2,1,__s);
                        lVar15 = 0;
                        do {
                          fprintf(__s,"%.9g, ",(double)*(float *)((long)pvVar16 + lVar15));
                          lVar15 = lVar15 + 4;
                        } while ((int)lVar15 != 0xc);
                        fwrite("}, ",3,1,__s);
                        iVar12 = iVar12 + 1;
                        pvVar17 = (void *)((long)pvVar16 + lVar15);
                      } while (iVar12 < (int)local_a8);
                      pvVar17 = (void *)((long)pvVar16 + lVar15);
                      iVar12 = (int)local_a0;
                    }
                    fwrite("},\n    ",7,1,__s);
                    iVar12 = iVar12 + 1;
                  } while (iVar12 < (int)local_a8);
                }
                fwrite("}, ",3,1,__s);
                iVar12 = local_94 + 1;
              } while (iVar12 < (int)local_a8);
            }
            fwrite("}, ",3,1,__s);
            uVar14 = (int)local_90 + 1;
            local_90 = (ulong)uVar14;
          } while (uVar14 != 3);
          fwrite("};\n",3,1,__s);
          fwrite("} // namespace pbrt\n",0x14,1,__s);
          fclose(__s);
          std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                    ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,
                     (pointer)0x0);
          return 0;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Could not create file!");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pcVar19 = "Invalid resolution!";
  }
  puts(pcVar19);
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 3) {
        printf("Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\n"
               "where <gamut> is one of "
               "sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020\n");
        exit(-1);
    }
    Gamut gamut = SRGB;
    if (argc > 3)
        gamut = parse_gamut(argv[3]);
    if (gamut == NO_GAMUT) {
        fprintf(stderr, "Could not parse gamut `%s'!\n", argv[3]);
        exit(-1);
    }
    init_tables(gamut);

    const int res = atoi(argv[1]);
    if (res == 0) {
        printf("Invalid resolution!\n");
        exit(-1);
    }

    int nThreads = AvailableCores();
    threadPool = std::make_unique<ThreadPool>(nThreads);

    printf("Optimizing %s spectra...\n", argv[3]);
    fflush(stdout);

    float *scale = new float[res];
    for (int k = 0; k < res; ++k)
        scale[k] = (float)smoothstep(smoothstep(k / double(res - 1)));

    size_t bufsize = 3 * 3 * res * res * res;
    float *out = new float[bufsize];

    for (int l = 0; l < 3; ++l) {
        ParallelFor(0, res, [&](size_t j) {
            const double y = j / double(res - 1);
            fflush(stdout);
            for (int i = 0; i < res; ++i) {
                const double x = i / double(res - 1);
                double coeffs[3], rgb[3];
                memset(coeffs, 0, sizeof(double) * 3);

                int start = res / 5;

                for (int k = start; k < res; ++k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    gauss_newton(rgb, coeffs);

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }

                memset(coeffs, 0, sizeof(double) * 3);
                for (int k = start; k >= 0; --k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    gauss_newton(rgb, coeffs);

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }
            }
        });
    }

    FILE *f = fopen(argv[2], "w");
    if (f == nullptr)
        throw std::runtime_error("Could not create file!");
    fprintf(f, "namespace pbrt {\n");
    fprintf(f, "extern const int %sToSpectrumTable_Res = %d;\n", argv[3], res);
    fprintf(f, "extern const float %sToSpectrumTable_Scale[%d] = {\n", argv[3], res);
    for (int i = 0; i < res; ++i)
        fprintf(f, "%.9g, ", scale[i]);
    fprintf(f, "};\n");
    fprintf(f, "extern const float %sToSpectrumTable_Data[3][%d][%d][%d][3] = {\n",
            argv[3], res, res, res);
    const float *ptr = out;
    for (int maxc = 0; maxc < 3; ++maxc) {
        fprintf(f, "{ ");
        for (int z = 0; z < res; ++z) {
            fprintf(f, "{ ");
            for (int y = 0; y < res; ++y) {
                fprintf(f, "{ ");
                for (int x = 0; x < res; ++x) {
                    fprintf(f, "{ ");
                    for (int c = 0; c < 3; ++c)
                        fprintf(f, "%.9g, ", *ptr++);
                    fprintf(f, "}, ");
                }
                fprintf(f, "},\n    ");
            }
            fprintf(f, "}, ");
        }
        fprintf(f, "}, ");
    }
    fprintf(f, "};\n");
    fprintf(f, "} // namespace pbrt\n");
    fclose(f);

    threadPool.reset();
}